

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O1

void nullcSetEnableTimeTrace(int enable)

{
  int iVar1;
  
  if (NULLC::TraceGetContext()::context == '\0') {
    iVar1 = __cxa_guard_acquire(&NULLC::TraceGetContext()::context);
    if (iVar1 != 0) {
      NULLC::TraceContext::TraceContext((TraceContext *)NULLC::TraceGetContext()::context);
      __cxa_atexit(NULLC::TraceContext::~TraceContext,NULLC::TraceGetContext()::context,
                   &__dso_handle);
      __cxa_guard_release(&NULLC::TraceGetContext()::context);
    }
  }
  NULLCTime::clockMicroInit();
  NULLC::traceContext = NULLC::TraceGetContext()::context;
  NULLC::TraceSetEnabled(enable != 0);
  return;
}

Assistant:

void nullcSetEnableTimeTrace(int enable)
{
	NULLC::traceContext = NULLC::TraceGetContext();
	NULLC::TraceSetEnabled(enable != 0);
}